

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::PatchInitValueNoFastPath
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  Type *typeWithoutProperty;
  int iVar1;
  ScriptContext *requestContext;
  undefined1 local_70 [8];
  PropertyValueInfo info;
  
  local_70 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_70,functionBody,inlineCache,inlineCacheIndex,true);
  typeWithoutProperty = (object->type).ptr;
  if (((((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 1) == 0) ||
      (iVar1 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[0x1b])(object,propertyId,newValue,0,local_70),
      iVar1 == 0)) &&
     (iVar1 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x1a])(object,propertyId,newValue,0,local_70),
     iVar1 == 0)) {
    return;
  }
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  CacheOperators::CachePropertyWrite
            (object,false,typeWithoutProperty,propertyId,(PropertyValueInfo *)local_70,
             requestContext);
  return;
}

Assistant:

void JavascriptOperators::PatchInitValueNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        Type *typeWithoutProperty = object->GetType();

        if (functionBody->IsEval())
        {
            if (object->InitPropertyInEval(propertyId, newValue, PropertyOperation_None, &info))
            {
                CacheOperators::CachePropertyWrite(object, false, typeWithoutProperty, propertyId, &info, functionBody->GetScriptContext());
                return;
            }
        }

        if (object->InitProperty(propertyId, newValue, PropertyOperation_None, &info))
        {
            CacheOperators::CachePropertyWrite(object, false, typeWithoutProperty, propertyId, &info, functionBody->GetScriptContext());
        }
    }